

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * des_decrypt_xdmauth_wrapper(ptrlen key,ptrlen data)

{
  strbuf *psVar1;
  strbuf *sb;
  ptrlen data_local;
  ptrlen key_local;
  
  if (key.len != 7) {
    fatal_error("des_decrypt_xdmauth: key must be 7 bytes long");
  }
  if (((undefined1  [16])data & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
    fatal_error("des_decrypt_xdmauth: data must be a multiple of 8 bytes");
  }
  psVar1 = strbuf_dup(data);
  des_decrypt_xdmauth(key.ptr,psVar1->u,(int)psVar1->len);
  return psVar1;
}

Assistant:

strbuf *des_decrypt_xdmauth_wrapper(ptrlen key, ptrlen data)
{
    if (key.len != 7)
        fatal_error("des_decrypt_xdmauth: key must be 7 bytes long");
    if (data.len % 8 != 0)
        fatal_error("des_decrypt_xdmauth: data must be a multiple of 8 bytes");
    strbuf *sb = strbuf_dup(data);
    des_decrypt_xdmauth(key.ptr, sb->u, sb->len);
    return sb;
}